

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::QuadMesh::getPrimBounds(QuadMesh *this,size_t primID,affine3f *xfm)

{
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *this_00;
  reference pvVar1;
  vec3f *in_RCX;
  size_type in_RDX;
  long in_RSI;
  box3f *in_RDI;
  affine3f *m;
  box3f *primBounds;
  vec3f *in_stack_ffffffffffffff38;
  box3f *this_01;
  
  this_01 = in_RDI;
  math::box3f::empty_box();
  this_00 = (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)(in_RSI + 0x70);
  m = (affine3f *)(in_RSI + 0xa0);
  pvVar1 = std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::operator[]
                     ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)m,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            (this_00,(long)pvVar1->x);
  math::xfmPoint(m,in_stack_ffffffffffffff38);
  math::box3f::extend(this_01,&in_RDI->lower);
  pvVar1 = std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::operator[]
                     ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)m,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            (this_00,(long)pvVar1->y);
  math::xfmPoint(m,in_stack_ffffffffffffff38);
  math::box3f::extend(this_01,&in_RDI->lower);
  pvVar1 = std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::operator[]
                     ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)m,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            (this_00,(long)pvVar1->z);
  math::xfmPoint(m,in_RCX);
  math::box3f::extend(this_01,&in_RDI->lower);
  pvVar1 = std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::operator[]
                     ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)m,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            (this_00,(long)pvVar1->w);
  math::xfmPoint(m,in_RCX);
  math::box3f::extend(this_01,&in_RDI->lower);
  return this_01;
}

Assistant:

box3f QuadMesh::getPrimBounds(const size_t primID, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].x]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].y]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].z]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].w]));
    return primBounds;
  }